

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_warnings_tests.cpp
# Opt level: O1

void __thiscall node_warnings_tests::warnings::test_method(warnings *this)

{
  bilingual_str message;
  bilingual_str message_00;
  bilingual_str message_01;
  bilingual_str message_02;
  bool bVar1;
  int iVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  vector<bilingual_str,_std::allocator<bilingual_str>_> messages;
  Warnings warnings;
  _Move_assign_alias<kernel::Warning,_node::Warning> in_stack_fffffffffffffb78;
  _Variant_storage_alias<kernel::Warning,_node::Warning> id;
  _Variant_storage_alias<kernel::Warning,_node::Warning> id_00;
  _Variant_storage_alias<kernel::Warning,_node::Warning> id_01;
  _Move_assign_alias<kernel::Warning,_node::Warning> _Var5;
  _Variant_storage_alias<kernel::Warning,_node::Warning> id_02;
  _Variant_storage_alias<kernel::Warning,_node::Warning> id_03;
  check_type cVar9;
  undefined8 in_stack_fffffffffffffb88;
  undefined8 in_stack_fffffffffffffb90;
  undefined8 in_stack_fffffffffffffb98;
  undefined8 in_stack_fffffffffffffba0;
  char *pcVar6;
  pointer pbVar7;
  pointer pbVar8;
  pointer in_stack_fffffffffffffbb8;
  undefined1 *local_440;
  undefined1 *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  lazy_ostream local_200;
  undefined1 *local_1f0;
  element_type **local_1e8;
  assertion_result local_1e0;
  assertion_result local_1c8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  long *local_190 [2];
  long local_180 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  long *local_150 [2];
  long local_140 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  long *local_110 [2];
  long local_100 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  long *local_d0 [2];
  long local_c0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  Warnings local_90;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ::node::Warnings::Warnings(&local_90);
  ::node::Warnings::Unset
            (&local_90,
             (warning_type)
             in_stack_fffffffffffffb78.super__Copy_assign_alias<kernel::Warning,_node::Warning>.
             super__Move_ctor_alias<kernel::Warning,_node::Warning>.
             super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
             super__Variant_storage_alias<kernel::Warning,_node::Warning>);
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1b;
  file.m_begin = (iterator)&local_1a0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1b0,msg);
  ::node::Warnings::GetMessages
            ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)&local_1e0,&local_90);
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_1e0.m_message.px == (element_type *)local_1e0._0_8_);
  local_1c8.m_message.px = (element_type *)0x0;
  local_1c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1e8 = (element_type **)&stack0xfffffffffffffba8;
  pcVar6 = "warnings.GetMessages().size() == 0";
  pbVar7 = (pointer)0xee51be;
  local_200.m_empty = false;
  local_200._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_1f0 = boost::unit_test::lazy_ostream::inst;
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_208 = "";
  id._M_u = (_Variadic_union<kernel::Warning,_node::Warning>)0x0;
  id._M_index = '\0';
  id._5_3_ = 0;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,&local_200,1,0,WARN,_cVar9,(size_t)&local_210,0x1b);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  std::vector<bilingual_str,_std::allocator<bilingual_str>_>::~vector
            ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)&local_1e0);
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x1d;
  file_00.m_begin = (iterator)&local_220;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_230,
             msg_00);
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"warning 1","");
  if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"warning 1","");
  }
  else {
    local_200._vptr_lazy_ostream = (_func_int **)0xee51bf;
    (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
              (&local_b0,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_200);
  }
  message.original._M_string_length = in_stack_fffffffffffffb88;
  message.original._M_dataplus._M_p = (pointer)_cVar9;
  message.original.field_2._M_allocated_capacity = in_stack_fffffffffffffb90;
  message.original.field_2._8_8_ = in_stack_fffffffffffffb98;
  message.translated._M_dataplus._M_p = (pointer)in_stack_fffffffffffffba0;
  message.translated._M_string_length = (size_type)pcVar6;
  message.translated.field_2._M_allocated_capacity = (size_type)pbVar7;
  message.translated.field_2._8_8_ = in_stack_fffffffffffffbb8;
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)::node::Warnings::Set(&local_90,(warning_type)id,message);
  local_1c8.m_message.px = (element_type *)0x0;
  local_1c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1e0._0_8_ = "warnings.Set(warning_1, _(\"warning 1\"))";
  local_1e0.m_message.px = (element_type *)0xee51f0;
  local_200.m_empty = false;
  local_200._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_1f0 = boost::unit_test::lazy_ostream::inst;
  local_1e8 = (element_type **)&local_1e0;
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_238 = "";
  id_00._M_u = (_Variadic_union<kernel::Warning,_node::Warning>)0x0;
  id_00._M_index = '\0';
  id_00._5_3_ = 0;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,&local_200,1,0,WARN,_cVar9,(size_t)&local_240,0x1d);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0],local_c0[0] + 1);
  }
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x1e;
  file_01.m_begin = (iterator)&local_250;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_260,
             msg_01);
  local_110[0] = local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"warning 2","");
  if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"warning 2","");
  }
  else {
    local_200._vptr_lazy_ostream = (_func_int **)0xee51f1;
    (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
              (&local_f0,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_200);
  }
  message_00.original._M_string_length = in_stack_fffffffffffffb88;
  message_00.original._M_dataplus._M_p = (pointer)_cVar9;
  message_00.original.field_2._M_allocated_capacity = in_stack_fffffffffffffb90;
  message_00.original.field_2._8_8_ = in_stack_fffffffffffffb98;
  message_00.translated._M_dataplus._M_p = (pointer)in_stack_fffffffffffffba0;
  message_00.translated._M_string_length = (size_type)pcVar6;
  message_00.translated.field_2._M_allocated_capacity = (size_type)pbVar7;
  message_00.translated.field_2._8_8_ = in_stack_fffffffffffffbb8;
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)::node::Warnings::Set(&local_90,(warning_type)id_00,message_00);
  local_1c8.m_message.px = (element_type *)0x0;
  local_1c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1e0._0_8_ = "warnings.Set(warning_2, _(\"warning 2\"))";
  local_1e0.m_message.px = (element_type *)0xee5222;
  local_200.m_empty = false;
  local_200._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_1f0 = boost::unit_test::lazy_ostream::inst;
  local_1e8 = (element_type **)&local_1e0;
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_268 = "";
  id_01._M_u = (_Variadic_union<kernel::Warning,_node::Warning>)0x0;
  id_01._M_index = '\0';
  id_01._5_3_ = 0;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,&local_200,1,0,WARN,_cVar9,(size_t)&local_270,0x1e);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_110[0] != local_100) {
    operator_delete(local_110[0],local_100[0] + 1);
  }
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x20;
  file_02.m_begin = (iterator)&local_280;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_290,
             msg_02);
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)::node::Warnings::Unset(&local_90,(warning_type)id_01);
  local_1c8.m_message.px = (element_type *)0x0;
  local_1c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1e0._0_8_ = "warnings.Unset(warning_2)";
  local_1e0.m_message.px = (element_type *)0xee523d;
  local_200.m_empty = false;
  local_200._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_1f0 = boost::unit_test::lazy_ostream::inst;
  local_1e8 = (element_type **)&local_1e0;
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_298 = "";
  _Var5.super__Copy_assign_alias<kernel::Warning,_node::Warning>.
  super__Move_ctor_alias<kernel::Warning,_node::Warning>.
  super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
  super__Variant_storage_alias<kernel::Warning,_node::Warning> =
       (_Copy_assign_alias<kernel::Warning,_node::Warning>)
       (_Move_ctor_alias<kernel::Warning,_node::Warning>)0x0;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,&local_200,1,0,WARN,_cVar9,(size_t)&local_2a0,0x20);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x22;
  file_03.m_begin = (iterator)&local_2b0;
  msg_03.m_end = pvVar4;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2c0,
             msg_03);
  bVar1 = ::node::Warnings::Unset
                    (&local_90,
                     (warning_type)
                     _Var5.super__Copy_assign_alias<kernel::Warning,_node::Warning>.
                     super__Move_ctor_alias<kernel::Warning,_node::Warning>.
                     super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
                     super__Variant_storage_alias<kernel::Warning,_node::Warning>);
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_1c8.m_message.px = (element_type *)0x0;
  local_1c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1e0._0_8_ = "!warnings.Unset(warning_2)";
  local_1e0.m_message.px = (element_type *)0xee523d;
  local_200.m_empty = false;
  local_200._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_1f0 = boost::unit_test::lazy_ostream::inst;
  local_1e8 = (element_type **)&local_1e0;
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_2c8 = "";
  id_02._M_u = (_Variadic_union<kernel::Warning,_node::Warning>)0x0;
  id_02._M_index = '\0';
  id_02._5_3_ = 0;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,&local_200,1,0,WARN,_cVar9,(size_t)&local_2d0,0x22);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x24;
  file_04.m_begin = (iterator)&local_2e0;
  msg_04.m_end = pvVar4;
  msg_04.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_2f0,
             msg_04);
  local_150[0] = local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"warning 2 - revision 1","");
  if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_130,"warning 2 - revision 1","");
  }
  else {
    local_200._vptr_lazy_ostream = (_func_int **)0xee523e;
    (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
              (&local_130,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_200);
  }
  message_01.original._M_string_length = in_stack_fffffffffffffb88;
  message_01.original._M_dataplus._M_p = (pointer)_cVar9;
  message_01.original.field_2._M_allocated_capacity = in_stack_fffffffffffffb90;
  message_01.original.field_2._8_8_ = in_stack_fffffffffffffb98;
  message_01.translated._M_dataplus._M_p = (pointer)in_stack_fffffffffffffba0;
  message_01.translated._M_string_length = (size_type)pcVar6;
  message_01.translated.field_2._M_allocated_capacity = (size_type)pbVar7;
  message_01.translated.field_2._8_8_ = in_stack_fffffffffffffbb8;
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)::node::Warnings::Set(&local_90,(warning_type)id_02,message_01);
  local_1c8.m_message.px = (element_type *)0x0;
  local_1c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1e0._0_8_ = "warnings.Set(warning_2, _(\"warning 2 - revision 1\"))";
  local_1e0.m_message.px = (element_type *)0xee5289;
  local_200.m_empty = false;
  local_200._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_1f0 = boost::unit_test::lazy_ostream::inst;
  local_1e8 = (element_type **)&local_1e0;
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_2f8 = "";
  id_03._M_u = (_Variadic_union<kernel::Warning,_node::Warning>)0x0;
  id_03._M_index = '\0';
  id_03._5_3_ = 0;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,&local_200,1,0,WARN,_cVar9,(size_t)&local_300,0x24);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if (local_150[0] != local_140) {
    operator_delete(local_150[0],local_140[0] + 1);
  }
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x26;
  file_05.m_begin = (iterator)&local_310;
  msg_05.m_end = pvVar4;
  msg_05.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_320,
             msg_05);
  local_190[0] = local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"warning 2 - revision 2","");
  if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_170,"warning 2 - revision 2","");
  }
  else {
    local_200._vptr_lazy_ostream = (_func_int **)0xee528a;
    (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
              (&local_170,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_200);
  }
  message_02.original._M_string_length = in_stack_fffffffffffffb88;
  message_02.original._M_dataplus._M_p = (pointer)_cVar9;
  message_02.original.field_2._M_allocated_capacity = in_stack_fffffffffffffb90;
  message_02.original.field_2._8_8_ = in_stack_fffffffffffffb98;
  message_02.translated._M_dataplus._M_p = (pointer)in_stack_fffffffffffffba0;
  message_02.translated._M_string_length = (size_type)pcVar6;
  message_02.translated.field_2._M_allocated_capacity = (size_type)pbVar7;
  message_02.translated.field_2._8_8_ = in_stack_fffffffffffffbb8;
  bVar1 = ::node::Warnings::Set(&local_90,(warning_type)id_03,message_02);
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_1c8.m_message.px = (element_type *)0x0;
  local_1c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1e0._0_8_ = "!warnings.Set(warning_2, _(\"warning 2 - revision 2\"))";
  local_1e0.m_message.px = (element_type *)0xee52d6;
  local_200.m_empty = false;
  local_200._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_1f0 = boost::unit_test::lazy_ostream::inst;
  local_1e8 = (element_type **)&local_1e0;
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_328 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,&local_200,1,0,WARN,_cVar9,(size_t)&local_330,0x26);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if (local_190[0] != local_180) {
    operator_delete(local_190[0],local_180[0] + 1);
  }
  ::node::Warnings::GetMessages
            ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)&local_1c8,&local_90);
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x2a;
  file_06.m_begin = (iterator)&local_340;
  msg_06.m_end = pvVar4;
  msg_06.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_350,
             msg_06);
  local_1e0.m_message.px = (element_type *)0x0;
  local_1e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_200.m_empty = false;
  local_200._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_1f0 = boost::unit_test::lazy_ostream::inst;
  local_1e8 = (element_type **)&stack0xfffffffffffffba8;
  local_360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_358 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_1e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((long)local_1c8.m_message.px -
        CONCAT71(local_1c8._1_7_,
                 local_1c8.p_predicate_value.super_readonly_property<bool>.
                 super_class_property<bool>.value) == 0x80);
  boost::test_tools::tt_detail::report_assertion
            (&local_1e0,&local_200,1,0,WARN,_cVar9,(size_t)&local_360,0x2a);
  boost::detail::shared_count::~shared_count(&local_1e0.m_message.pn);
  local_370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_368 = "";
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x2b;
  file_07.m_begin = (iterator)&local_370;
  msg_07.m_end = pvVar4;
  msg_07.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_380,
             msg_07);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT71(local_1c8._1_7_,
                              local_1c8.p_predicate_value.super_readonly_property<bool>.
                              super_class_property<bool>.value),"warning 1");
  local_1e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_1e0.m_message.px = (element_type *)0x0;
  local_1e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_200.m_empty = false;
  local_200._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_1f0 = boost::unit_test::lazy_ostream::inst;
  local_1e8 = (element_type **)&stack0xfffffffffffffba8;
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_388 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1e0,&local_200,1,0,WARN,_cVar9,(size_t)&local_390,0x2b);
  boost::detail::shared_count::~shared_count(&local_1e0.m_message.pn);
  local_3a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_398 = "";
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x2c;
  file_08.m_begin = (iterator)&local_3a0;
  msg_08.m_end = pvVar4;
  msg_08.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_3b0,
             msg_08);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (CONCAT71(local_1c8._1_7_,
                               local_1c8.p_predicate_value.super_readonly_property<bool>.
                               super_class_property<bool>.value) + 0x40),"warning 2 - revision 1");
  local_1e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_1e0.m_message.px = (element_type *)0x0;
  local_1e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_200.m_empty = false;
  local_200._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_1f0 = boost::unit_test::lazy_ostream::inst;
  local_1e8 = (element_type **)&stack0xfffffffffffffba8;
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_3b8 = "";
  _Var5.super__Copy_assign_alias<kernel::Warning,_node::Warning>.
  super__Move_ctor_alias<kernel::Warning,_node::Warning>.
  super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
  super__Variant_storage_alias<kernel::Warning,_node::Warning> =
       (_Copy_assign_alias<kernel::Warning,_node::Warning>)
       (_Move_ctor_alias<kernel::Warning,_node::Warning>)0x0;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1e0,&local_200,1,0,WARN,_cVar9,(size_t)&local_3c0,0x2c);
  boost::detail::shared_count::~shared_count(&local_1e0.m_message.pn);
  local_3d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_3c8 = "";
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x2f;
  file_09.m_begin = (iterator)&local_3d0;
  msg_09.m_end = pvVar4;
  msg_09.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_3e0,
             msg_09);
  local_1e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ::node::Warnings::Unset
                 (&local_90,
                  (warning_type)
                  _Var5.super__Copy_assign_alias<kernel::Warning,_node::Warning>.
                  super__Move_ctor_alias<kernel::Warning,_node::Warning>.
                  super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
                  super__Variant_storage_alias<kernel::Warning,_node::Warning>);
  local_1e0.m_message.px = (element_type *)0x0;
  local_1e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_200.m_empty = false;
  local_200._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_1f0 = boost::unit_test::lazy_ostream::inst;
  local_1e8 = (element_type **)&stack0xfffffffffffffba8;
  local_3f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_3e8 = "";
  _Var5.super__Copy_assign_alias<kernel::Warning,_node::Warning>.
  super__Move_ctor_alias<kernel::Warning,_node::Warning>.
  super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
  super__Variant_storage_alias<kernel::Warning,_node::Warning> =
       (_Copy_assign_alias<kernel::Warning,_node::Warning>)
       (_Move_ctor_alias<kernel::Warning,_node::Warning>)0x0;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1e0,&local_200,1,0,WARN,_cVar9,(size_t)&local_3f0,0x2f);
  boost::detail::shared_count::~shared_count(&local_1e0.m_message.pn);
  local_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_3f8 = "";
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x30;
  file_10.m_begin = (iterator)&local_400;
  msg_10.m_end = pvVar4;
  msg_10.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_410,
             msg_10);
  local_1e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ::node::Warnings::Unset
                 (&local_90,
                  (warning_type)
                  _Var5.super__Copy_assign_alias<kernel::Warning,_node::Warning>.
                  super__Move_ctor_alias<kernel::Warning,_node::Warning>.
                  super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
                  super__Variant_storage_alias<kernel::Warning,_node::Warning>);
  local_1e0.m_message.px = (element_type *)0x0;
  local_1e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  pbVar7 = (pointer)0xee5224;
  pbVar8 = (pointer)0xee523d;
  local_200.m_empty = false;
  local_200._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_1f0 = boost::unit_test::lazy_ostream::inst;
  local_1e8 = (element_type **)&stack0xfffffffffffffba8;
  local_420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_418 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1e0,&local_200,1,0,WARN,_cVar9,(size_t)&local_420,0x30);
  boost::detail::shared_count::~shared_count(&local_1e0.m_message.pn);
  local_430 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_428 = "";
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x31;
  file_11.m_begin = (iterator)&local_430;
  msg_11.m_end = pvVar4;
  msg_11.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_440,
             msg_11);
  ::node::Warnings::GetMessages
            ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)&stack0xfffffffffffffba8,
             &local_90);
  local_1e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(pbVar8 == pbVar7);
  local_1e0.m_message.px = (element_type *)0x0;
  local_1e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1e8 = (element_type **)&stack0xfffffffffffffb98;
  local_200.m_empty = false;
  local_200._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_1f0 = boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_1e0,&local_200,1,0,WARN,_cVar9,(size_t)&stack0xfffffffffffffb88,0x31);
  boost::detail::shared_count::~shared_count(&local_1e0.m_message.pn);
  std::vector<bilingual_str,_std::allocator<bilingual_str>_>::~vector
            ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)&stack0xfffffffffffffba8);
  std::vector<bilingual_str,_std::allocator<bilingual_str>_>::~vector
            ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)&local_1c8);
  std::
  _Rb_tree<std::variant<kernel::Warning,_node::Warning>,_std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>,_std::_Select1st<std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>_>,_std::less<std::variant<kernel::Warning,_node::Warning>_>,_std::allocator<std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>_>_>
  ::~_Rb_tree(&local_90.m_warnings._M_t);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(warnings)
{
    node::Warnings warnings;
    // On pre-release builds, a warning is generated automatically
    warnings.Unset(node::Warning::PRE_RELEASE_TEST_BUILD);

    // For these tests, we don't care what the exact warnings are, so
    // just refer to them as warning_1 and warning_2
    const auto warning_1{node::Warning::CLOCK_OUT_OF_SYNC};
    const auto warning_2{node::Warning::FATAL_INTERNAL_ERROR};

    // Ensure we start without any warnings
    BOOST_CHECK(warnings.GetMessages().size() == 0);
    // Add two warnings
    BOOST_CHECK(warnings.Set(warning_1, _("warning 1")));
    BOOST_CHECK(warnings.Set(warning_2, _("warning 2")));
    // Unset the second one
    BOOST_CHECK(warnings.Unset(warning_2));
    // Since it's already been unset, this should return false
    BOOST_CHECK(!warnings.Unset(warning_2));
    // We should now be able to set w2 again
    BOOST_CHECK(warnings.Set(warning_2, _("warning 2 - revision 1")));
    // Setting w2 again should return false since it's already set
    BOOST_CHECK(!warnings.Set(warning_2, _("warning 2 - revision 2")));

    // Verify messages are correct
    const auto messages{warnings.GetMessages()};
    BOOST_CHECK(messages.size() == 2);
    BOOST_CHECK(messages[0].original == "warning 1");
    BOOST_CHECK(messages[1].original == "warning 2 - revision 1");

    // Clearing all warnings should also clear all messages
    BOOST_CHECK(warnings.Unset(warning_1));
    BOOST_CHECK(warnings.Unset(warning_2));
    BOOST_CHECK(warnings.GetMessages().size() == 0);
}